

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall (anonymous_namespace)::StatTestSimple::~StatTestSimple(StatTestSimple *this)

{
  anon_unknown.dwarf_e210f::StatTest::~StatTest((StatTest *)(this + -0x118));
  operator_delete((StatTest *)(this + -0x118),0x1a8);
  return;
}

Assistant:

TEST_F(StatTest, Simple) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL);
  ASSERT_EQ(2u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_EQ("in",  stats_[1]);
}